

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O2

uint32_t estimateSqrt32(int aExp,uint32_t a)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  uint uVar3;
  uint uVar4;
  
  if ((aExp & 1U) == 0) {
    uVar3 = (a >> 0x11 | 0x8000) - (uint)estimateSqrt32::sqrtEvenAdjustments[a >> 0x1b & 0xf];
    uVar3 = a / uVar3 + uVar3;
    uVar4 = 0xffff8000;
    if (uVar3 < 0x20000) {
      uVar4 = uVar3 * 0x8000;
    }
    if (uVar4 <= a) {
      return (int)a >> 1;
    }
  }
  else {
    uVar4 = ((a >> 0x11) - (uint)estimateSqrt32::sqrtOddAdjustments[a >> 0x1b & 0xf]) + 0x4000;
    uVar4 = uVar4 * 0x8000 + (a / uVar4) * 0x4000;
    a = a >> 1;
  }
  auVar1._4_8_ = 0;
  auVar1._0_4_ = uVar4;
  auVar2._4_8_ = 0;
  auVar2._0_4_ = a;
  return (uVar4 >> 1) + SUB124((auVar2 << 0x1f) / auVar1,0);
}

Assistant:

static inline uint32_t estimateSqrt32(int aExp, uint32_t a)
{
    static const uint16_t sqrtOddAdjustments[] = {
        0x0004, 0x0022, 0x005D, 0x00B1, 0x011D, 0x019F, 0x0236, 0x02E0,
        0x039C, 0x0468, 0x0545, 0x0631, 0x072B, 0x0832, 0x0946, 0x0A67
    };
    static const uint16_t sqrtEvenAdjustments[] = {
        0x0A2D, 0x08AF, 0x075A, 0x0629, 0x051A, 0x0429, 0x0356, 0x029E,
        0x0200, 0x0179, 0x0109, 0x00AF, 0x0068, 0x0034, 0x0012, 0x0002
    };
    int8_t index;
    uint32_t z;

    index = ( a>>27 ) & 15;
    if ( aExp & 1 ) {
        z = 0x4000 + ( a>>17 ) - sqrtOddAdjustments[ (int)index ];
        z = ( ( a / z )<<14 ) + ( z<<15 );
        a >>= 1;
    }
    else {
        z = 0x8000 + ( a>>17 ) - sqrtEvenAdjustments[ (int)index ];
        z = a / z + z;
        z = ( 0x20000 <= z ) ? 0xFFFF8000 : ( z<<15 );
        if ( z <= a ) return (uint32_t) ( ( (int32_t) a )>>1 );
    }
    return ( (uint32_t) ( ( ( (uint64_t) a )<<31 ) / z ) ) + ( z>>1 );

}